

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# univalue_get.cpp
# Opt level: O0

vector<UniValue,_std::allocator<UniValue>_> * __thiscall UniValue::getValues(UniValue *this)

{
  runtime_error *this_00;
  UniValue *this_local;
  
  if ((this->typ != VOBJ) && (this->typ != VARR)) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"JSON value is not an object or array as expected");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  return &this->values;
}

Assistant:

const std::vector<UniValue>& UniValue::getValues() const
{
    if (typ != VOBJ && typ != VARR)
        throw std::runtime_error("JSON value is not an object or array as expected");
    return values;
}